

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_repair(char *filename)

{
  mcpl_file_t mVar1;
  FILE *f_00;
  FILE *__stream;
  uint64_t nparticles2;
  FILE *fh;
  uint64_t nparticles;
  mcpl_file_t f;
  int repair_status;
  int *in_stack_00000050;
  char *in_stack_00000058;
  mcpl_file_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  mVar1 = mcpl_actual_open_file(in_stack_00000058,in_stack_00000050);
  f_00 = (FILE *)mcpl_hdr_nparticles(mVar1);
  mcpl_close_file(in_stack_ffffffffffffffd0);
  mcpl_error((char *)0x1048b6);
  __stream = (FILE *)mcpl_internal_fopen((char *)f_00,in_stack_ffffffffffffffd8);
  if (__stream == (FILE *)0x0) {
    mcpl_error((char *)0x1048f9);
  }
  mcpl_update_nparticles(f_00,(uint64_t)__stream);
  fclose(__stream);
  mVar1 = mcpl_actual_open_file(in_stack_00000058,in_stack_00000050);
  mcpl_hdr_nparticles(mVar1);
  mcpl_close_file(mVar1);
  mcpl_error((char *)0x104983);
  return;
}

Assistant:

void mcpl_repair(const char * filename)
{
  int repair_status = 1;
  mcpl_file_t f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0) {
    mcpl_error("File does not appear to be broken.");
  } else if (repair_status==1) {
    mcpl_error("Input file is indeed broken, but must be gunzipped before it can be repaired.");
  } else if (repair_status==2) {
    mcpl_error("File must be gunzipped before it can be checked and possibly repaired.");
  }
  //Ok, we should repair the file by updating nparticles in the header:
  FILE * fh = mcpl_internal_fopen(filename,"r+b");
  if (!fh)
    mcpl_error("Unable to open file in update mode!");
  mcpl_update_nparticles(fh, nparticles);
  fclose(fh);
  //Verify that we fixed it:
  repair_status = 1;
  f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles2 = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0&&nparticles==nparticles2) {
    printf("MCPL: Successfully repaired file with %" PRIu64 " particles.\n",nparticles);
  } else {
    mcpl_error("Something went wrong while attempting to repair file.");
  }
}